

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ForwardTypedefDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForwardTypedefDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4)

{
  Token typedefKeyword;
  Token keyword;
  Token name;
  Token semi;
  ForwardTypedefDeclarationSyntax *this_00;
  Token *args_local_4;
  Token *args_local_3;
  Token *args_local_2;
  Token *args_local_1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ForwardTypedefDeclarationSyntax *)allocate(this,0x80,8);
  typedefKeyword.kind = args_1->kind;
  typedefKeyword._2_1_ = args_1->field_0x2;
  typedefKeyword.numFlags.raw = (args_1->numFlags).raw;
  typedefKeyword.rawLen = args_1->rawLen;
  typedefKeyword.info = args_1->info;
  keyword.kind = args_2->kind;
  keyword._2_1_ = args_2->field_0x2;
  keyword.numFlags.raw = (args_2->numFlags).raw;
  keyword.rawLen = args_2->rawLen;
  keyword.info = args_2->info;
  name.kind = args_3->kind;
  name._2_1_ = args_3->field_0x2;
  name.numFlags.raw = (args_3->numFlags).raw;
  name.rawLen = args_3->rawLen;
  name.info = args_3->info;
  semi.kind = args_4->kind;
  semi._2_1_ = args_4->field_0x2;
  semi.numFlags.raw = (args_4->numFlags).raw;
  semi.rawLen = args_4->rawLen;
  semi.info = args_4->info;
  slang::syntax::ForwardTypedefDeclarationSyntax::ForwardTypedefDeclarationSyntax
            (this_00,args,typedefKeyword,keyword,name,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }